

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O2

ggml_backend_feature * ggml_backend_cpu_get_features(ggml_backend_reg_t reg)

{
  int iVar1;
  ggml_backend_feature local_18;
  
  if (ggml_backend_cpu_get_features(ggml_backend_reg*)::features == '\0') {
    iVar1 = __cxa_guard_acquire(&ggml_backend_cpu_get_features(ggml_backend_reg*)::features);
    if (iVar1 != 0) {
      ggml_cpu_init();
      ggml_backend_cpu_get_features::features.
      super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ggml_backend_cpu_get_features::features.
      super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ggml_backend_cpu_get_features::features.
      super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar1 = ggml_cpu_has_sse3();
      if (iVar1 != 0) {
        local_18.name = "SSE3";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_ssse3();
      if (iVar1 != 0) {
        local_18.name = "SSSE3";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_avx();
      if (iVar1 != 0) {
        local_18.name = "AVX";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_avx_vnni();
      if (iVar1 != 0) {
        local_18.name = "AVX_VNNI";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_avx2();
      if (iVar1 != 0) {
        local_18.name = "AVX2";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_f16c();
      if (iVar1 != 0) {
        local_18.name = "F16C";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_fma();
      if (iVar1 != 0) {
        local_18.name = "FMA";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_bmi2();
      if (iVar1 != 0) {
        local_18.name = "BMI2";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_avx512();
      if (iVar1 != 0) {
        local_18.name = "AVX512";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_avx512_vbmi();
      if (iVar1 != 0) {
        local_18.name = "AVX512_VBMI";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_avx512_vnni();
      if (iVar1 != 0) {
        local_18.name = "AVX512_VNNI";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_avx512_bf16();
      if (iVar1 != 0) {
        local_18.name = "AVX512_BF16";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_amx_int8();
      if (iVar1 != 0) {
        local_18.name = "AMX_INT8";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_neon();
      if (iVar1 != 0) {
        local_18.name = "NEON";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_arm_fma();
      if (iVar1 != 0) {
        local_18.name = "ARM_FMA";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_fp16_va();
      if (iVar1 != 0) {
        local_18.name = "FP16_VA";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_matmul_int8();
      if (iVar1 != 0) {
        local_18.name = "MATMUL_INT8";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_sve();
      if (iVar1 != 0) {
        local_18.name = "SVE";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_dotprod();
      if (iVar1 != 0) {
        local_18.name = "DOTPROD";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_get_sve_cnt();
      if (0 < iVar1) {
        if (ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::sve_cnt_abi_cxx11_
            == '\0') {
          iVar1 = __cxa_guard_acquire(&ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::
                                       operator()()::sve_cnt_abi_cxx11_);
          if (iVar1 != 0) {
            iVar1 = ggml_cpu_get_sve_cnt();
            std::__cxx11::to_string
                      ((string *)
                       &ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::
                        sve_cnt_abi_cxx11_,iVar1);
            __cxa_atexit(std::__cxx11::string::~string,
                         &ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::
                          sve_cnt_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()
                                 ::sve_cnt_abi_cxx11_);
          }
        }
        local_18.name = "SVE_CNT";
        local_18.value =
             ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::sve_cnt_abi_cxx11_
        ;
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_sme();
      if (iVar1 != 0) {
        local_18.name = "SME";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_riscv_v();
      if (iVar1 != 0) {
        local_18.name = "RISCV_V";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_vsx();
      if (iVar1 != 0) {
        local_18.name = "VSX";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_vxe();
      if (iVar1 != 0) {
        local_18.name = "VXE";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_wasm_simd();
      if (iVar1 != 0) {
        local_18.name = "WASM_SIMD";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      iVar1 = ggml_cpu_has_llamafile();
      if (iVar1 != 0) {
        local_18.name = "LLAMAFILE";
        local_18.value = "1";
        std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
        emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      }
      local_18.name = "AARCH64_REPACK";
      local_18.value = "1";
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      local_18.name = (char *)0x0;
      local_18.value = (char *)0x0;
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      emplace_back<ggml_backend_feature>(&ggml_backend_cpu_get_features::features,&local_18);
      __cxa_atexit(std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::~vector
                   ,&ggml_backend_cpu_get_features::features,&__dso_handle);
      __cxa_guard_release(&ggml_backend_cpu_get_features(ggml_backend_reg*)::features);
    }
  }
  return ggml_backend_cpu_get_features::features.
         super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

static ggml_backend_feature * ggml_backend_cpu_get_features(ggml_backend_reg_t reg) {
    static std::vector<ggml_backend_feature> features = []() {
        ggml_cpu_init();

        std::vector<ggml_backend_feature> features;
        if (ggml_cpu_has_sse3()) {
            features.push_back({ "SSE3", "1" });
        }
        if (ggml_cpu_has_ssse3()) {
            features.push_back({ "SSSE3", "1" });
        }
        if (ggml_cpu_has_avx()) {
            features.push_back({ "AVX", "1" });
        }
        if (ggml_cpu_has_avx_vnni()) {
            features.push_back({ "AVX_VNNI", "1" });
        }
        if (ggml_cpu_has_avx2()) {
            features.push_back({ "AVX2", "1" });
        }
        if (ggml_cpu_has_f16c()) {
            features.push_back({ "F16C", "1" });
        }
        if (ggml_cpu_has_fma()) {
            features.push_back({ "FMA", "1" });
        }
        if (ggml_cpu_has_bmi2()) {
            features.push_back({ "BMI2", "1" });
        }
        if (ggml_cpu_has_avx512()) {
            features.push_back({ "AVX512", "1" });
        }
        if (ggml_cpu_has_avx512_vbmi()) {
            features.push_back({ "AVX512_VBMI", "1" });
        }
        if (ggml_cpu_has_avx512_vnni()) {
            features.push_back({ "AVX512_VNNI", "1" });
        }
        if (ggml_cpu_has_avx512_bf16()) {
            features.push_back({ "AVX512_BF16", "1" });
        }
        if (ggml_cpu_has_amx_int8()) {
            features.push_back({ "AMX_INT8", "1" });
        }
        if (ggml_cpu_has_neon()) {
            features.push_back({ "NEON", "1" });
        }
        if (ggml_cpu_has_arm_fma()) {
            features.push_back({ "ARM_FMA", "1" });
        }
        if (ggml_cpu_has_fp16_va()) {
            features.push_back({ "FP16_VA", "1" });
        }
        if (ggml_cpu_has_matmul_int8()) {
            features.push_back({ "MATMUL_INT8", "1" });
        }
        if (ggml_cpu_has_sve()) {
            features.push_back({ "SVE", "1" });
        }
        if (ggml_cpu_has_dotprod()) {
            features.push_back({ "DOTPROD", "1" });
        }
        if (ggml_cpu_get_sve_cnt() > 0) {
            static std::string sve_cnt = std::to_string(ggml_cpu_get_sve_cnt());
            features.push_back({ "SVE_CNT", sve_cnt.c_str() });
        }
        if (ggml_cpu_has_sme()) {
            features.push_back({ "SME", "1" });
        }
        if (ggml_cpu_has_riscv_v()) {
            features.push_back({ "RISCV_V", "1" });
        }
        if (ggml_cpu_has_vsx()) {
            features.push_back({ "VSX", "1" });
        }
        if (ggml_cpu_has_vxe()) {
            features.push_back({ "VXE", "1" });
        }
        if (ggml_cpu_has_wasm_simd()) {
            features.push_back({ "WASM_SIMD", "1" });
        }
        if (ggml_cpu_has_llamafile()) {
            features.push_back({ "LLAMAFILE", "1" });
        }
    #ifdef GGML_USE_ACCELERATE
        features.push_back({ "ACCELERATE", "1" });
    #endif
    #ifdef GGML_USE_CPU_HBM
        features.push_back({ "CPU_HBM", "1" });
    #endif
    #ifdef GGML_USE_OPENMP
        features.push_back({ "OPENMP", "1" });
    #endif
    #ifdef GGML_USE_CPU_KLEIDIAI
        features.push_back({ "KLEIDIAI", "1" });
    #endif
    #ifdef GGML_USE_CPU_AARCH64
        features.push_back({ "AARCH64_REPACK", "1" });
    #endif

        features.push_back({ nullptr, nullptr });

        return features;
    }();

    return features.data();

    GGML_UNUSED(reg);
}